

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

bool isColDataNull(HighsLogOptions *log_options,double *usr_col_cost,double *usr_col_lower,
                  double *usr_col_upper)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  bool null_data;
  byte local_10a;
  string *in_stack_ffffffffffffff00;
  double *in_stack_ffffffffffffff08;
  allocator *user_data;
  undefined6 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff16;
  byte bVar3;
  undefined1 in_stack_ffffffffffffff17;
  byte local_ca;
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [39];
  byte local_21;
  string *local_20;
  
  local_20 = (string *)CONCAT71(in_register_00000009,in_CL);
  local_21 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"column costs",&local_49);
  bVar1 = doubleUserDataNotNull
                    ((HighsLogOptions *)
                     CONCAT17(in_stack_ffffffffffffff17,
                              CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
                     in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  local_ca = 1;
  if (!bVar1) {
    local_ca = local_21;
  }
  local_21 = local_ca & 1;
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"column lower bounds",&local_81);
  uVar2 = doubleUserDataNotNull
                    ((HighsLogOptions *)
                     CONCAT17(in_stack_ffffffffffffff17,
                              CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
                     in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  bVar3 = 1;
  if (!(bool)uVar2) {
    bVar3 = local_21;
  }
  local_21 = bVar3 & 1;
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  user_data = &local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"column upper bounds",user_data);
  bVar1 = doubleUserDataNotNull
                    ((HighsLogOptions *)CONCAT17(uVar2,CONCAT16(bVar3,in_stack_ffffffffffffff10)),
                     (double *)user_data,local_20);
  local_10a = 1;
  if (!bVar1) {
    local_10a = local_21;
  }
  local_21 = local_10a & 1;
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  return (bool)(local_21 & 1);
}

Assistant:

bool isColDataNull(const HighsLogOptions& log_options,
                   const double* usr_col_cost, const double* usr_col_lower,
                   const double* usr_col_upper) {
  bool null_data = false;
  null_data =
      doubleUserDataNotNull(log_options, usr_col_cost, "column costs") ||
      null_data;
  null_data = doubleUserDataNotNull(log_options, usr_col_lower,
                                    "column lower bounds") ||
              null_data;
  null_data = doubleUserDataNotNull(log_options, usr_col_upper,
                                    "column upper bounds") ||
              null_data;
  return null_data;
}